

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mraa-i2c.c
# Opt level: O0

int main(int argc,char **argv)

{
  char **argv_local;
  int argc_local;
  
  mraa_set_log_level(7);
  if (argc == 1) {
    run_interactive_mode();
    argv_local._4_4_ = 0;
  }
  else {
    argv_local._4_4_ = process_command(argc,argv);
  }
  return argv_local._4_4_;
}

Assistant:

int
main(int argc, char** argv)
{
    mraa_set_log_level(7);
    if (argc == 1) {
        run_interactive_mode();
        return 0;
    } else
        return process_command(argc, argv);
}